

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_locale.cpp
# Opt level: O1

bool ON_Locale::SetPeriodAsCRuntimeDecimalPoint(void)

{
  bool bVar1;
  char *pcVar2;
  
  bVar1 = PeriodIsCRuntimeDecimalPoint();
  if (!bVar1) {
    pcVar2 = setlocale(1,"C");
    if ((pcVar2 == (char *)0x0) || (*pcVar2 != 'C')) {
      bVar1 = false;
    }
    else {
      bVar1 = pcVar2[1] == '\0';
    }
    if (bVar1 != false) {
      bVar1 = PeriodIsCRuntimeDecimalPoint();
      return bVar1;
    }
  }
  return bVar1;
}

Assistant:

bool ON_Locale::SetPeriodAsCRuntimeDecimalPoint()
{
  bool rc = ON_Locale::PeriodIsCRuntimeDecimalPoint();
  if (false == rc)
  {
#if defined(ON_COMPILER_MSC)
    // Microsoft's C compiler
    const int prev_type = _configthreadlocale(_DISABLE_PER_THREAD_LOCALE);

    const char* s = setlocale(LC_NUMERIC, "C");
    rc = (0 != s && 'C' == s[0] && 0 == s[1]);
    if (rc)
      rc = ON_Locale::PeriodIsCRuntimeDecimalPoint();

    if (prev_type != _DISABLE_PER_THREAD_LOCALE && prev_type >= 0)
      _configthreadlocale(prev_type);

#elif defined(ON_COMPILER_CLANG) || defined(ON_COMPILER_GNU)
    // Apple's Clang compiler
    const char* s = setlocale(LC_NUMERIC, "C");
    rc = (0 != s && 'C' == s[0] && 0 == s[1]);
    if (rc)
      rc = ON_Locale::PeriodIsCRuntimeDecimalPoint();
#else
    // another compiler
    const int prev_type = _configthreadlocale(_DISABLE_PER_THREAD_LOCALE);

    const char* s = setlocale(LC_NUMERIC, "C");
    rc = (0 != s && 'C' == s[0] && 0 == s[1]);
    if (rc)
      rc = ON_Locale::PeriodIsCRuntimeDecimalPoint();

    if (prev_type != _DISABLE_PER_THREAD_LOCALE && prev_type >= 0)
      _configthreadlocale(prev_type);
#endif
  }
  return rc;
}